

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.cc
# Opt level: O0

void GEN_CS::gen_cs_test_example(multi_ex *examples,label *cs_labels)

{
  bool bVar1;
  v_array<COST_SENSITIVE::wclass> *this;
  v_array<COST_SENSITIVE::wclass> *pvVar2;
  wclass *pwVar3;
  v_array<COST_SENSITIVE::wclass> *in_RSI;
  vector<example_*,_std::allocator<example_*>_> *in_RDI;
  wclass wc;
  uint32_t i;
  bool shared;
  wclass *in_stack_ffffffffffffffc8;
  v_array<COST_SENSITIVE::wclass> *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe8;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffec;
  uint uVar5;
  
  v_array<COST_SENSITIVE::wclass>::clear(in_stack_ffffffffffffffd0);
  std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RDI,0);
  bVar1 = CB::ec_is_example_header
                    ((example *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  uVar5 = (uint)bVar1 << 0x18;
  uVar4 = 0;
  while( true ) {
    this = (v_array<COST_SENSITIVE::wclass> *)(ulong)uVar4;
    pvVar2 = (v_array<COST_SENSITIVE::wclass> *)
             std::vector<example_*,_std::allocator<example_*>_>::size(in_RDI);
    if (pvVar2 <= this) break;
    v_array<COST_SENSITIVE::wclass>::push_back(this,in_stack_ffffffffffffffc8);
    uVar4 = uVar4 + 1;
  }
  if ((uVar5 & 0x1000000) != 0) {
    pwVar3 = v_array<COST_SENSITIVE::wclass>::operator[](in_RSI,0);
    pwVar3->class_index = 0;
    pwVar3 = v_array<COST_SENSITIVE::wclass>::operator[](in_RSI,0);
    pwVar3->x = -3.4028235e+38;
  }
  return;
}

Assistant:

void gen_cs_test_example(multi_ex& examples, COST_SENSITIVE::label& cs_labels)
{
  cs_labels.costs.clear();
  bool shared = CB::ec_is_example_header(*examples[0]);
  for (uint32_t i = 0; i < examples.size(); i++)
  {
    COST_SENSITIVE::wclass wc = {FLT_MAX, i, 0., 0.};
    if (shared && i > 0)
      wc.class_index = (uint32_t)i - 1;
    cs_labels.costs.push_back(wc);
  }

  if (shared)  // take care of shared examples
  {
    cs_labels.costs[0].class_index = 0;
    cs_labels.costs[0].x = -FLT_MAX;
  }
}